

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O3

Alloc<void>
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
alloc_not_small<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>
          (size_t size,
          Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *self)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  BVar4;
  Alloc<void> AVar5;
  Node *pNVar6;
  Node *n;
  uintptr_t ras;
  Node *pNVar7;
  size_t size_00;
  sizeclass_t sizeclass;
  long *in_FS_OFFSET;
  Pair<capptr::Chunk<void>,_SlabMetadata_*> PVar8;
  anon_class_1_0_00000001 local_9;
  
  if (size == 0) {
    if ((self->super_FastFreeLists).small_fast_free_lists[0].curr.unsafe_capptr !=
        (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
         *)0x0) {
      BVar4 = freelist::
              Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
              ::
              take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                        ((Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                          *)self,&freelist::Object::key_root,(anon_class_8_1_8991fb9c)self);
      return (Alloc<void>)BVar4.unsafe_capptr;
    }
    if ((self->remote_alloc).list.front.unsafe_capptr._M_b._M_p ==
        (self->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
      AVar5 = Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
              small_alloc<(snmalloc::ZeroMem)0,_snmalloc::CheckInitPthread>::anon_class_1_0_00000001
              ::operator()(&local_9,self,0,
                           (Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                            *)self);
    }
    else {
      AVar5 = handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                        ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                          *)self,self,0,self);
    }
  }
  else {
    if ((self->remote_alloc).list.front.unsafe_capptr._M_b._M_p !=
        (self->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
      AVar5 = handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::alloc_not_small<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long>
                        ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                          *)self,self,size);
      return (Alloc<void>)AVar5.unsafe_capptr;
    }
    if ((Alloc *)*in_FS_OFFSET == &ThreadAlloc::default_alloc) {
      AVar5 = ThreadAlloc::CheckInitBase<snmalloc::CheckInitPthread>::operator()(size);
      return (Alloc<void>)AVar5.unsafe_capptr;
    }
    if (size < 0x8000000000000001) {
      uVar1 = size - 1;
      uVar2 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      sizeclass.value = uVar2 ^ 0x3f;
      size_00 = 1L << (-(char)sizeclass.value & 0x3fU);
      if (size < 3) {
        size_00 = size;
      }
      if (size < 0xe001) {
        ras = (long)&(self->remote_alloc).list.front.unsafe_capptr._M_b._M_p +
              (ulong)(byte)(&sizeclass_lookup)[uVar1 >> 4];
        sizeclass.value = (ulong)(byte)(&sizeclass_lookup)[uVar1 >> 4] + 0x40;
      }
      else {
        ras = (long)&(self->remote_alloc).list.back.unsafe_capptr._M_b._M_p + sizeclass.value;
      }
      PVar8 = BackendAllocator<snmalloc::PALLinux,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_snmalloc::DummyAuthmap,_snmalloc::MetaProtectedRangeLocalState<snmalloc::PALLinux,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>,_14UL>_>
              ::alloc_chunk(&self->backend_state,size_00,ras,sizeclass);
      pNVar7 = (Node *)PVar8.second;
      AVar5.unsafe_capptr = (void *)PVar8.first.unsafe_capptr;
      if (pNVar7 != (Node *)0x0) {
        pNVar6 = (Node *)((ulong)pNVar7 >> 3 ^ (ulong)AVar5.unsafe_capptr ^
                         freelist::Object::key_root.key_next);
        pNVar7[2].next = pNVar7 + 1;
        *(undefined2 *)&pNVar7[3].next = 0;
        pNVar7[1].next = pNVar6;
        pNVar7[2].prev = (Node *)&pNVar7[1].prev;
        *(undefined4 *)((long)&pNVar7[3].next + 2) = 0x10000;
        pNVar7[1].prev = pNVar6;
        *(undefined1 *)((long)&pNVar7[3].next + 7) = 1;
        pNVar6 = (self->laden).head.next;
        pNVar7->next = pNVar6;
        pNVar6->prev = pNVar7;
        pNVar7->prev = &(self->laden).head;
        (self->laden).head.next = pNVar7;
      }
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = 0xc;
      AVar5.unsafe_capptr = (void *)0x0;
    }
  }
  return (Alloc<void>)AVar5.unsafe_capptr;
}

Assistant:

static SNMALLOC_SLOW_PATH capptr::Alloc<void>
    alloc_not_small(size_t size, Allocator* self)
    {
      if (size == 0)
      {
        // Deal with alloc zero of with a small object here.
        // Alternative semantics giving nullptr is also allowed by the
        // standard.
        return self->small_alloc<NoZero, CheckInit>(1);
      }

      return self->handle_message_queue(
        [](Allocator* self, size_t size) -> capptr::Alloc<void> {
          return CheckInit::check_init(
            [self, size]() {
              if (size > bits::one_at_bit(bits::BITS - 1))
              {
                // Cannot allocate something that is more that half the size of
                // the address space
                errno = ENOMEM;
                return capptr::Alloc<void>{nullptr};
              }

              // Check if secondary allocator wants to offer the memory
              void* result = SecondaryAllocator::allocate(
                [size]() -> stl::Pair<size_t, size_t> {
                  return {size, natural_alignment(size)};
                });
              if (result != nullptr)
              {
                if constexpr (zero_mem == YesZero)
                  Config::Pal::zero(result, size);
                return capptr::Alloc<void>::unsafe_from(result);
              }

              // Grab slab of correct size
              // Set remote as large allocator remote.
              auto [chunk, meta] = Config::Backend::alloc_chunk(
                self->get_backend_local_state(),
                large_size_to_chunk_size(size),
                PagemapEntry::encode(
                  self->public_state(), size_to_sizeclass_full(size)),
                size_to_sizeclass_full(size));

#ifdef SNMALLOC_TRACING
              message<1024>(
                "size {} pow2size {}", size, bits::next_pow2_bits(size));
#endif

              // set up meta data so sizeclass is correct, and hence alloc size,
              // and external pointer. Initialise meta data for a successful
              // large allocation.
              if (meta != nullptr)
              {
                meta->initialise_large(
                  address_cast(chunk), freelist::Object::key_root);
                self->laden.insert(meta);
              }

              if (zero_mem == YesZero && chunk.unsafe_ptr() != nullptr)
              {
                Config::Pal::template zero<false>(
                  chunk.unsafe_ptr(), bits::next_pow2(size));
              }

              return capptr_chunk_is_alloc(
                capptr_to_user_address_control(chunk));
            },
            [](Allocator* a, size_t size) {
              return alloc_not_small<zero_mem, CheckInitNoOp>(size, a);
            },
            size);
        },
        self,
        size);
    }